

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int nMaxDepth;
  uint fVerbose;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  long lVar11;
  Gia_Man_t *pNew;
  Abc_Ntk_t *pNtk;
  int iVar12;
  word wVar13;
  char *pcVar14;
  byte *pbVar15;
  char *pcVar16;
  uint uVar17;
  byte bVar18;
  ulong uVar19;
  int *pArrTimeProfile_00;
  ulong uVar20;
  ulong uVar21;
  word *__s;
  bool bVar22;
  int local_29c;
  uint local_298;
  undefined8 local_278;
  int pArrTimeProfile [8];
  word pTruth [64];
  
  bVar22 = false;
  Extra_UtilGetoptReset();
  nMaxDepth = -1;
  local_298 = 400000;
  local_278 = 1;
  fVerbose = 0;
  local_29c = 0;
  bVar4 = false;
  bVar5 = false;
  do {
    while (iVar7 = Extra_UtilGetopt(argc,argv,"DASCatvh"), iVar8 = globalUtilOptind, iVar7 != 0x44)
    {
      if (iVar7 < 0x53) {
        if (iVar7 == -1) {
          if (bVar22) {
            puts("run test suite, ignore all other settings");
            Abc_ExactTest(fVerbose);
            Abc_ExactStoreTest(fVerbose);
            return 0;
          }
          if (globalUtilOptind != argc) {
            memset(pTruth,0,0x200);
            if (argc <= globalUtilOptind) {
              uVar20 = 0;
              goto LAB_0024d391;
            }
            uVar17 = argc - globalUtilOptind;
            uVar20 = 0;
            lVar11 = (long)globalUtilOptind;
            goto LAB_0024d0f7;
          }
          goto LAB_0024cf86;
        }
        if (iVar7 == 0x41) {
          lVar11 = (long)globalUtilOptind;
          if (argc <= globalUtilOptind) {
            pcVar14 = "Command line switch \"-A\" should be followed by an integer.\n";
            goto LAB_0024cf7a;
          }
          globalUtilOptind = globalUtilOptind + 1;
          pcVar14 = argv[lVar11];
          pcVar16 = argv[lVar11];
          while( true ) {
            pcVar3 = pcVar14;
            pcVar14 = pcVar3 + 1;
            if (*pcVar3 == '\0') break;
            if (*pcVar3 == ',') {
              *pcVar3 = '\0';
              iVar8 = atoi(pcVar16);
              lVar11 = (long)local_29c;
              local_29c = local_29c + 1;
              pArrTimeProfile[lVar11] = iVar8;
              *pcVar3 = ',';
              pcVar16 = pcVar14;
            }
          }
          iVar8 = atoi(pcVar16);
          lVar11 = (long)local_29c;
          local_29c = local_29c + 1;
          pArrTimeProfile[lVar11] = iVar8;
          bVar5 = true;
        }
        else {
          if (iVar7 != 0x43) goto LAB_0024cf86;
          if (argc <= globalUtilOptind) {
            pcVar14 = "Command line switch \"-C\" should be followed by an integer.\n";
            goto LAB_0024cf7a;
          }
          local_298 = atoi(argv[globalUtilOptind]);
          globalUtilOptind = iVar8 + 1;
        }
      }
      else if (iVar7 < 0x74) {
        if (iVar7 == 0x53) {
          if (argc <= globalUtilOptind) {
            pcVar14 = "Command line switch \"-S\" should be followed by an integer.\n";
            goto LAB_0024cf7a;
          }
          iVar7 = atoi(argv[globalUtilOptind]);
          local_278 = CONCAT44(extraout_var,iVar7);
          globalUtilOptind = iVar8 + 1;
          if (iVar7 < 1) goto LAB_0024cf86;
        }
        else {
          if (iVar7 != 0x61) goto LAB_0024cf86;
          bVar4 = (bool)(bVar4 ^ 1);
        }
      }
      else if (iVar7 == 0x74) {
        bVar22 = (bool)(bVar22 ^ 1);
      }
      else {
        if (iVar7 != 0x76) goto LAB_0024cf86;
        fVerbose = fVerbose ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      pcVar14 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_0024cf7a;
    }
    nMaxDepth = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar8 + 1;
  } while (-1 < nMaxDepth);
LAB_0024cf86:
  Abc_Print(-2,"usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n");
  Abc_Print(-2,
            "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n"
           );
  Abc_Print(-2,"\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n");
  Abc_Print(-2,"\t-A <list> : input arrival times (comma separated list)\n");
  Abc_Print(-2,"\t-S <num>  : number of start gates in search [default = %d]\n",local_278);
  Abc_Print(-2,
            "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n",
            (ulong)local_298);
  pcVar16 = "yes";
  pcVar14 = "yes";
  if (!bVar4) {
    pcVar14 = "no";
  }
  Abc_Print(-2,"\t-a        : toggle create AIG [default = %s]\n",pcVar14);
  Abc_Print(-2,"\t-t        : run test suite\n");
  if (fVerbose == 0) {
    pcVar16 = "no";
  }
  Abc_Print(-2,"\t-v        : toggle verbose printout [default = %s]\n",pcVar16);
  Abc_Print(-2,"\t-h        : print the command usage\n");
  Abc_Print(-2,"\t\n");
  Abc_Print(-2,
            "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
           );
  Abc_Print(-2,"\t            The author can be contacted as mathias.soeken at epfl.ch\n");
  return 1;
LAB_0024d0f7:
  if (uVar20 == 0x10) {
    pcVar14 = "Too many functions (at most 16 supported).\n";
    goto LAB_0024cf7a;
  }
  globalUtilOptind = (int)(lVar11 + 1);
  pbVar15 = (byte *)argv[lVar11];
  if (*pbVar15 == 0x30) {
    pbVar15 = pbVar15 + (ulong)(pbVar15[1] == 0x78) * 2;
  }
  bVar18 = *pbVar15;
  if ((0xf5 < (byte)(bVar18 - 0x3a)) || (uVar21 = 0, 0xf9 < (byte)((bVar18 & 0xdf) + 0xb9))) {
    uVar21 = 0;
    do {
      do {
        lVar6 = uVar21 + 1;
        uVar21 = uVar21 + 1;
      } while (0xf5 < (byte)(pbVar15[lVar6] - 0x3a));
    } while (0xf9 < (byte)((pbVar15[lVar6] & 0xdf) + 0xb9));
  }
  __s = pTruth + uVar20 * 4;
  iVar7 = (int)uVar21;
  iVar8 = iVar7;
  if (iVar7 == 0) {
LAB_0024d1e6:
    iVar8 = iVar8 + 2;
LAB_0024d1e9:
    uVar9 = 1 << ((char)iVar8 - 6U & 0x1f);
    if (iVar8 < 7) {
      uVar9 = 1;
    }
    if (0 < (int)uVar9) {
      memset(__s,0,(ulong)uVar9 << 3);
    }
    if (iVar7 != 0) {
      pbVar15 = pbVar15 + iVar7;
      bVar18 = 0;
      uVar19 = 0;
      do {
        pbVar15 = pbVar15 + -1;
        bVar1 = *pbVar15;
        if ((byte)(bVar1 - 0x30) < 10) {
          iVar7 = -0x30;
        }
        else if ((byte)(bVar1 + 0xbf) < 6) {
          iVar7 = -0x37;
        }
        else {
          iVar7 = -0x57;
          if (5 < (byte)(bVar1 + 0x9f)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                          ,0x3c8,"int Abc_TtReadHexDigit(char)");
          }
        }
        __s[uVar19 >> 4 & 0xfffffff] =
             __s[uVar19 >> 4 & 0xfffffff] | (ulong)(uint)(iVar7 + (char)bVar1) << (bVar18 & 0x3c);
        uVar19 = uVar19 + 1;
        bVar18 = bVar18 + 4;
      } while ((uVar21 & 0xffffffff) != uVar19);
    }
    if (iVar8 < 6) {
      if (iVar8 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                      ,0x392,"word Abc_Tt6Stretch(word, int)");
      }
      iVar7 = iVar8;
      if (iVar8 == 2) {
        iVar7 = 3;
      }
      iVar12 = iVar7;
      if (iVar7 == 3) {
        iVar12 = 4;
      }
      iVar10 = iVar12;
      if (iVar12 == 4) {
        iVar10 = 5;
      }
      if (1 < iVar10 - 5U) {
        __assert_fail("nVars == 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                      ,0x39f,"word Abc_Tt6Stretch(word, int)");
      }
      uVar9 = (uint)*__s & 0xf;
      uVar21 = (ulong)(uVar9 << 4 | uVar9);
      if (iVar8 != 2) {
        uVar21 = *__s;
      }
      uVar19 = (ulong)(uint)((int)(uVar21 & 0xff) << 8) | uVar21 & 0xff;
      if (iVar7 != 3) {
        uVar19 = uVar21;
      }
      uVar21 = (ulong)(uint)((int)uVar19 << 0x10) | uVar19 & 0xffff;
      if (iVar12 != 4) {
        uVar21 = uVar19;
      }
      wVar13 = (uVar21 & 0xffffffff) * 0x100000001;
      if (iVar10 != 5) {
        wVar13 = uVar21;
      }
      goto LAB_0024d346;
    }
  }
  else {
    if (iVar7 != 1) {
      uVar9 = iVar7 - 1;
      if (uVar9 == 0) {
        iVar8 = 0;
      }
      else {
        uVar2 = 0x1f;
        if (uVar9 != 0) {
          for (; uVar9 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar8 = (uVar2 ^ 0xffffffe0) + 0x21;
      }
      goto LAB_0024d1e6;
    }
    iVar8 = 2;
    if (0x40 < bVar18) {
      if (bVar18 == 0x41) {
LAB_0024d1b7:
        wVar13 = 0xaaaaaaaaaaaaaaaa;
        if (bVar18 == 0x35) {
          wVar13 = 0x5555555555555555;
        }
        iVar8 = 1;
        goto LAB_0024d346;
      }
      if (bVar18 == 0x46) goto LAB_0024d1a7;
      goto LAB_0024d1e9;
    }
    if (bVar18 != 0x30) {
      if (bVar18 != 0x35) goto LAB_0024d1e9;
      goto LAB_0024d1b7;
    }
LAB_0024d1a7:
    iVar8 = 0;
    wVar13 = -(ulong)(bVar18 != 0x30);
LAB_0024d346:
    *__s = wVar13;
  }
  if (local_29c != 0) {
    if (8 < local_29c) {
      pcVar14 = "Only 8-variable functions are supported.\n";
LAB_0024cf7a:
      Abc_Print(-1,pcVar14);
      goto LAB_0024cf86;
    }
    bVar22 = local_29c != iVar8;
    iVar8 = local_29c;
    if (bVar22) {
      pcVar14 = "All functions need to have the same size.\n";
      goto LAB_0024cf7a;
    }
  }
  uVar20 = uVar20 + 1;
  lVar11 = lVar11 + 1;
  local_29c = iVar8;
  if (uVar20 == uVar17) goto LAB_0024d391;
  goto LAB_0024d0f7;
LAB_0024d391:
  pArrTimeProfile_00 = pArrTimeProfile;
  if (!bVar5) {
    pArrTimeProfile_00 = (int *)0x0;
  }
  iVar8 = (int)local_278 + -1;
  if (bVar4) {
    pNew = Gia_ManFindExact(pTruth,local_29c,(int)uVar20,nMaxDepth,pArrTimeProfile_00,local_298,
                            iVar8,fVerbose);
    if (pNew == (Gia_Man_t *)0x0) {
      pcVar14 = 
      "Could not find AIG within given resource constraints, retry with different value for -C.\n";
LAB_0024d488:
      Abc_Print(0,pcVar14);
      return 0;
    }
    Abc_FrameUpdateGia(pAbc,pNew);
  }
  else {
    pNtk = Abc_NtkFindExact(pTruth,local_29c,(int)uVar20,nMaxDepth,pArrTimeProfile_00,local_298,
                            iVar8,fVerbose);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar14 = 
      "Could not find network within given resource constraints, retry with different value for -C.\n"
      ;
      goto LAB_0024d488;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
    Abc_FrameClearVerifStatus(pAbc);
  }
  return 0;
}

Assistant:

int Abc_CommandExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrivalTimes, int nBTLimit, int nStartGates, int fVerbose );

    int c, nMaxDepth = -1, fMakeAIG = 0, fTest = 0, fVerbose = 0, nVars = 0, nVarsTmp, nFunc = 0, nStartGates = 1, nBTLimit = 400000;
    char * p1, * p2;
    word pTruth[64];
    int pArrTimeProfile[8], fHasArrTimeProfile = 0;
    Abc_Ntk_t * pNtkRes;
    Gia_Man_t * pGiaRes;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DASCatvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxDepth < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            fHasArrTimeProfile = 1;
            p1 = p2 = argv[globalUtilOptind++];
            while ( true ) {
                if ( *p2 == ',' )
                {
                    *p2 = '\0';
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    *p2++ = ',';
                    p1 = p2;
                }
                else if ( *p2 == '\0' )
                {
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    break;
                }
                else
                    ++p2;
            }
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStartGates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStartGates < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'a':
            fMakeAIG ^= 1;
            break;
        case 't':
            fTest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fTest )
    {
        extern void Abc_ExactTest( int fVerbose );
        extern void Abc_ExactStoreTest( int fVerbose );

        printf( "run test suite, ignore all other settings\n" );
        Abc_ExactTest( fVerbose );
        Abc_ExactStoreTest( fVerbose );
        return 0;
    }

    if ( argc == globalUtilOptind )
        goto usage;

    memset( pTruth, 0, 64 * sizeof(word) );
    while ( globalUtilOptind < argc )
    {
        if ( nFunc == 16 )
        {
            Abc_Print( -1, "Too many functions (at most 16 supported).\n" );
            goto usage;
        }
        nVarsTmp = Abc_TtReadHex( &pTruth[nFunc << 2], argv[globalUtilOptind++] );
        nFunc++;
        if ( nVars == 0 )
            nVars = nVarsTmp;
        else if ( nVars > 8 )
        {
            Abc_Print( -1, "Only 8-variable functions are supported.\n" );
            goto usage;
        }
        else if ( nVars != nVarsTmp )
        {
            Abc_Print( -1, "All functions need to have the same size.\n" );
            goto usage;
        }
    }

    if ( fMakeAIG )
    {
        pGiaRes = Gia_ManFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pGiaRes )
            Abc_FrameUpdateGia( pAbc, pGiaRes );
        else
            Abc_Print( 0, "Could not find AIG within given resource constraints, retry with different value for -C.\n" );
    }
    else
    {
        pNtkRes = Abc_NtkFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pNtkRes )
        {
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
            Abc_FrameClearVerifStatus( pAbc );
        }
        else
            Abc_Print( 0, "Could not find network within given resource constraints, retry with different value for -C.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n" );
    Abc_Print( -2, "\t-A <list> : input arrival times (comma separated list)\n" );
    Abc_Print( -2, "\t-S <num>  : number of start gates in search [default = %d]\n", nStartGates );
    Abc_Print( -2, "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-a        : toggle create AIG [default = %s]\n", fMakeAIG ? "yes" : "no" );
    Abc_Print( -2, "\t-t        : run test suite\n" );
    Abc_Print( -2, "\t-v        : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h        : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t            The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}